

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_palette.cpp
# Opt level: O1

void __thiscall
FPalette::MakeRemap(FPalette *this,DWORD *colors,BYTE *remap,BYTE *useful,int numcolors)

{
  uint uVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  BYTE BVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  PalEntry *pal;
  uint uVar13;
  RemappingWork workspace [511];
  undefined8 local_1030;
  uint local_1028;
  char local_1024 [2036];
  uint uStack_830;
  char acStack_82c [2044];
  
  lVar3 = 1;
  do {
    *(uint32 *)(&local_1030 + lVar3) = this->BaseColors[lVar3].field_0.d & 0xffffff;
    *(undefined1 *)((long)&local_1030 + lVar3 * 8 + 4) = 0;
    *(char *)((long)&local_1030 + lVar3 * 8 + 5) = (char)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x100);
  if (numcolors < 1) {
    iVar6 = 0;
    uVar13 = 0xff;
  }
  else {
    uVar13 = 0xff;
    uVar5 = 0;
    iVar6 = 0;
    do {
      if ((useful == (BYTE *)0x0) || (useful[uVar5] != '\0')) {
        lVar3 = (long)(int)uVar13;
        *(DWORD *)(local_1024 + lVar3 * 8 + -4) = colors[uVar5] & 0xffffff;
        local_1024[lVar3 * 8] = '\x01';
        local_1024[lVar3 * 8 + 1] = (char)uVar5;
        uVar13 = uVar13 + 1;
        iVar6 = iVar6 + 1;
      }
      else {
        remap[uVar5] = '\0';
      }
      uVar5 = uVar5 + 1;
    } while ((uint)numcolors != uVar5);
  }
  local_1030 = remap;
  qsort(&local_1028,(long)(int)uVar13,8,sortforremap2);
  if (1 < (int)uVar13) {
    iVar4 = 0;
    do {
      lVar3 = (long)iVar4;
      if (((local_1024[lVar3 * 8] != '\0') && (local_1024[lVar3 * 8 + 8] == '\0')) &&
         (*(int *)(local_1024 + lVar3 * 8 + -4) == *(int *)(local_1024 + (lVar3 + 1) * 8 + -4))) {
        iVar4 = iVar4 + 1;
        local_1030[(byte)local_1024[lVar3 * 8 + 1]] = local_1024[(lVar3 + 1) * 8 + 1];
        local_1024[lVar3 * 8] = '\x02';
        iVar6 = iVar6 + -1;
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < (int)(uVar13 - 1));
  }
  if (0 < (int)uVar13 && 0 < iVar6) {
    uVar5 = 0;
    do {
      if (local_1024[uVar5 * 8] == '\x01') {
        uVar1 = *(uint *)(local_1024 + uVar5 * 8 + -4);
        iVar4 = 0x30603;
        uVar9 = 1;
        uVar10 = 1;
        do {
          iVar12 = (uVar1 >> 0x10 & 0xff) - (uint)this->BaseColors[uVar10].field_0.field_0.r;
          iVar7 = (uVar1 >> 8 & 0xff) - (uint)this->BaseColors[uVar10].field_0.field_0.g;
          iVar11 = (uVar1 & 0xff) - (uint)this->BaseColors[uVar10].field_0.field_0.b;
          iVar7 = iVar11 * iVar11 + iVar7 * iVar7 + iVar12 * iVar12;
          bVar2 = true;
          if (iVar7 < iVar4) {
            if (iVar7 == 0) {
              bVar2 = false;
              iVar6 = (int)uVar10;
            }
            else {
              uVar9 = uVar10 & 0xffffffff;
              iVar4 = iVar7;
            }
          }
          BVar8 = (BYTE)uVar9;
          if (!bVar2) {
            BVar8 = (BYTE)iVar6;
            break;
          }
          uVar10 = uVar10 + 1;
        } while ((int)uVar10 != 0xff);
        local_1030[(byte)local_1024[uVar5 * 8 + 1]] = BVar8;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar13);
  }
  return;
}

Assistant:

void FPalette::MakeRemap (const DWORD *colors, BYTE *remap, const BYTE *useful, int numcolors) const
{
	RemappingWork workspace[255+256];
	int i, j, k;

	// Fill in workspace with the colors from the passed palette and this palette.
	// By sorting this array, we can quickly find exact matches so that we can
	// minimize the time spent calling BestColor for near matches.

	for (i = 1; i < 256; ++i)
	{
		workspace[i-1].Color = DWORD(BaseColors[i]) & 0xFFFFFF;
		workspace[i-1].Foreign = 0;
		workspace[i-1].PalEntry = i;
	}
	for (i = k = 0, j = 255; i < numcolors; ++i)
	{
		if (useful == NULL || useful[i] != 0)
		{
			workspace[j].Color = colors[i] & 0xFFFFFF;
			workspace[j].Foreign = 1;
			workspace[j].PalEntry = i;
			++j;
			++k;
		}
		else
		{
			remap[i] = 0;
		}
	}
	qsort (workspace, j, sizeof(RemappingWork), sortforremap2);

	// Find exact matches
	--j;
	for (i = 0; i < j; ++i)
	{
		if (workspace[i].Foreign)
		{
			if (!workspace[i+1].Foreign && workspace[i].Color == workspace[i+1].Color)
			{
				remap[workspace[i].PalEntry] = workspace[i+1].PalEntry;
				workspace[i].Foreign = 2;
				++i;
				--k;
			}
		}
	}

	// Find near matches
	if (k > 0)
	{
		for (i = 0; i <= j; ++i)
		{
			if (workspace[i].Foreign == 1)
			{
				remap[workspace[i].PalEntry] = BestColor ((DWORD *)BaseColors,
					RPART(workspace[i].Color), GPART(workspace[i].Color), BPART(workspace[i].Color),
					1, 255);
			}
		}
	}
}